

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_descriptor.h
# Opt level: O1

FormatDescriptor *
ktx::createFormatDescriptor(FormatDescriptor *__return_storage_ptr__,uint32_t *dfd)

{
  byte bVar1;
  uint uVar2;
  uint32_t uVar3;
  FormatDescriptor *pFVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  basicDescriptor basic;
  vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_> samples;
  vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_> local_88;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  FormatDescriptor *local_50;
  vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_> local_48;
  
  local_70 = (ulong)dfd[3];
  local_58 = (ulong)dfd[4];
  local_68 = (ulong)dfd[5];
  local_60 = (ulong)dfd[6];
  local_88.super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
  _M_impl.super__Vector_impl_data._M_finish = (sample *)0x0;
  local_88.super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (sample *)0x0;
  local_50 = __return_storage_ptr__;
  if (3 < (dfd[2] >> 0x12) - 6) {
    lVar13 = 9;
    uVar14 = 0;
    do {
      if (local_88.
          super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_88.
          super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>::
        _M_realloc_insert<>(&local_88,
                            (iterator)
                            local_88.
                            super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
      }
      else {
        *(undefined8 *)
         local_88.
         super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
         _M_impl.super__Vector_impl_data._M_finish = 0;
        (local_88.
         super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
         _M_impl.super__Vector_impl_data._M_finish)->lower = 0;
        (local_88.
         super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
         _M_impl.super__Vector_impl_data._M_finish)->upper = 0;
        local_88.
        super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_88.
             super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      uVar3 = dfd[lVar13 + -2];
      uVar8 = CONCAT62((int6)((ulong)*(undefined8 *)
                                      (local_88.
                                       super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                                       ._M_impl.super__Vector_impl_data._M_finish + -1) >> 0x10),
                       (short)uVar3);
      *(ulong *)(local_88.
                 super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1) = uVar8;
      bVar1 = *(byte *)((long)dfd + lVar13 * 4 + -6);
      uVar5 = (ulong)bVar1 << 0x10;
      *(ulong *)(local_88.
                 super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1) =
           uVar8 & 0xffffffffff00ffff | uVar5;
      uVar6 = (ulong)(dfd[lVar13 + -2] & 0xf000000);
      *(ulong *)(local_88.
                 super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1) =
           uVar8 & 0xfffffffff000ffff | uVar5 | uVar6;
      uVar2 = dfd[lVar13 + -2];
      uVar15 = (ulong)(uVar2 & 0x80000000);
      uVar16 = (ulong)(uVar2 & 0x40000000);
      uVar9 = (ulong)(uVar2 & 0x20000000);
      uVar7 = (ulong)(uVar2 & 0x10000000);
      *(ulong *)(local_88.
                 super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1) =
           uVar7 | uVar9 | uVar16 | uVar8 & 0xffffffff0000ffff | uVar5 | uVar6 | uVar15;
      uVar10 = (ulong)(byte)dfd[lVar13 + -1] << 0x20;
      *(ulong *)(local_88.
                 super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1) =
           uVar7 | uVar9 | uVar16 | uVar8 & 0xffffff000000ffff | uVar5 | uVar6 | uVar15 | uVar10;
      uVar11 = (ulong)*(byte *)((long)dfd + lVar13 * 4 + -3) << 0x28;
      *(ulong *)(local_88.
                 super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1) =
           uVar7 | uVar9 | uVar16 | uVar8 & 0xffff00000000ffff | uVar5 | uVar6 | uVar15 | uVar10 |
           uVar11;
      uVar12 = (ulong)*(byte *)((long)dfd + lVar13 * 4 + -2) << 0x30;
      *(ulong *)(local_88.
                 super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1) =
           uVar7 | uVar9 | uVar16 | uVar8 & 0xff0000000000ffff | uVar5 | uVar6 | uVar15 | uVar10 |
           uVar11 | uVar12;
      *(ulong *)(local_88.
                 super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1) =
           uVar7 | uVar9 | uVar16 | CONCAT12(bVar1,(short)uVar3) | uVar6 | uVar15 | uVar10 | uVar11
           | uVar12 | (ulong)*(byte *)((long)dfd + lVar13 * 4 + -1) << 0x38;
      local_88.
      super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
      _M_impl.super__Vector_impl_data._M_finish[-1].lower =
           dfd[(ulong)((uint)lVar13 - 1 & 0xfffffffc) + 1];
      local_88.
      super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
      _M_impl.super__Vector_impl_data._M_finish[-1].upper =
           dfd[(ulong)((uint)lVar13 & 0xfffffffd) + 1];
      uVar14 = uVar14 + 1;
      lVar13 = lVar13 + 4;
    } while (uVar14 < (dfd[2] >> 0x12) - 6 >> 2);
  }
  pFVar4 = local_50;
  basic._0_8_ = (ulong)((uint)local_58 >> 0x18) << 0x38 |
                (ulong)((uint)(local_58 >> 0x10) & 0xff) << 0x30 |
                (ulong)((uint)(local_58 >> 8) & 0xff) << 0x28 |
                ((ulong)((uint)local_58 & 0xff) << 0x20) + local_70;
  basic._8_8_ = (ulong)((uint)local_60 >> 0x18) << 0x38 |
                (ulong)((uint)(local_60 >> 0x10) & 0xff) << 0x30 |
                (ulong)((uint)(local_60 >> 8) & 0xff) << 0x28 |
                ((ulong)((uint)local_60 & 0xff) << 0x20) + local_68;
  local_48.super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_88.
       super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_48.super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_88.
       super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_88.
       super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_88.super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FormatDescriptor::FormatDescriptor(local_50,basic,&local_48);
  if (local_48.
      super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88.
      super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pFVar4;
}

Assistant:

[[nodiscard]] inline FormatDescriptor createFormatDescriptor(const uint32_t* dfd) {
    const auto* bdfd = dfd + 1;

    FormatDescriptor::basicDescriptor basic;
    basic.colorModel = khr_df_model_e(KHR_DFDVAL(bdfd, MODEL));
    basic.colorPrimaries = khr_df_primaries_e(KHR_DFDVAL(bdfd, PRIMARIES));
    basic.transferFunction = khr_df_transfer_e(KHR_DFDVAL(bdfd, TRANSFER));
    basic.dataFlags = khr_df_flags_e(KHR_DFDVAL(bdfd, FLAGS));
    basic.texelBlockDimension0 = KHR_DFDVAL(bdfd, TEXELBLOCKDIMENSION0);
    basic.texelBlockDimension1 = KHR_DFDVAL(bdfd, TEXELBLOCKDIMENSION1);
    basic.texelBlockDimension2 = KHR_DFDVAL(bdfd, TEXELBLOCKDIMENSION2);
    basic.texelBlockDimension3 = KHR_DFDVAL(bdfd, TEXELBLOCKDIMENSION3);
    basic.bytesPlane0 = KHR_DFDVAL(bdfd, BYTESPLANE0);
    basic.bytesPlane1 = KHR_DFDVAL(bdfd, BYTESPLANE1);
    basic.bytesPlane2 = KHR_DFDVAL(bdfd, BYTESPLANE2);
    basic.bytesPlane3 = KHR_DFDVAL(bdfd, BYTESPLANE3);
    basic.bytesPlane4 = KHR_DFDVAL(bdfd, BYTESPLANE4);
    basic.bytesPlane5 = KHR_DFDVAL(bdfd, BYTESPLANE5);
    basic.bytesPlane6 = KHR_DFDVAL(bdfd, BYTESPLANE6);
    basic.bytesPlane7 = KHR_DFDVAL(bdfd, BYTESPLANE7);

    std::vector<FormatDescriptor::sample> samples;
    for (uint32_t i = 0; i < KHR_DFDSAMPLECOUNT(bdfd); ++i) {
        auto& sample = samples.emplace_back();
        sample.bitOffset = KHR_DFDSVAL(bdfd, i, BITOFFSET);
        sample.bitLength = KHR_DFDSVAL(bdfd, i, BITLENGTH);
        sample.channelType = KHR_DFDSVAL(bdfd, i, CHANNELID);
        const auto dataType = KHR_DFDSVAL(bdfd, i, QUALIFIERS);
        sample.qualifierFloat = (dataType & KHR_DF_SAMPLE_DATATYPE_FLOAT) != 0;
        sample.qualifierSigned = (dataType & KHR_DF_SAMPLE_DATATYPE_SIGNED) != 0;
        sample.qualifierExponent = (dataType & KHR_DF_SAMPLE_DATATYPE_EXPONENT) != 0;
        sample.qualifierLinear = (dataType & KHR_DF_SAMPLE_DATATYPE_LINEAR) != 0;
        sample.samplePosition0 = KHR_DFDSVAL(bdfd, i, SAMPLEPOSITION0);
        sample.samplePosition1 = KHR_DFDSVAL(bdfd, i, SAMPLEPOSITION1);
        sample.samplePosition2 = KHR_DFDSVAL(bdfd, i, SAMPLEPOSITION2);
        sample.samplePosition3 = KHR_DFDSVAL(bdfd, i, SAMPLEPOSITION3);
        sample.lower = KHR_DFDSVAL(bdfd, i, SAMPLELOWER);
        sample.upper = KHR_DFDSVAL(bdfd, i, SAMPLEUPPER);
    }

    return FormatDescriptor{basic, std::move(samples)};
}